

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O2

bool __thiscall
embree::TokenStream::tryIdentifier(TokenStream *this,Token *token,ParseLocation *loc)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  string str;
  string local_88;
  Token local_68;
  
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  puVar2 = (uint *)Stream<int>::peek((this->cin).ptr);
  if (((ulong)*puVar2 < 0x100) && (this->isAlphaMap[*puVar2] != false)) {
    Stream<int>::get((this->cin).ptr);
    std::__cxx11::string::push_back((char)&str);
    while( true ) {
      puVar2 = (uint *)Stream<int>::peek((this->cin).ptr);
      uVar1 = *puVar2;
      if ((0xff < (ulong)uVar1) || ((uVar1 - 0x30 < 10 | this->isAlphaMap[uVar1]) != 1)) break;
      Stream<int>::get((this->cin).ptr);
      std::__cxx11::string::push_back((char)&str);
    }
    std::__cxx11::string::string((string *)&local_88,(string *)&str);
    Token::Token(&local_68,&local_88,TY_IDENTIFIER,loc);
    Token::operator=(token,&local_68);
    Token::~Token(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&str);
  return bVar3;
}

Assistant:

bool TokenStream::tryIdentifier(Token& token, const ParseLocation& loc)
  {
    std::string str;
    if (!isAlpha(cin->peek())) return false;
    str += (char)cin->get();
    while (isAlphaNum(cin->peek())) str += (char)cin->get();
    token = Token(str,Token::TY_IDENTIFIER,loc);
    return true;
  }